

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRUtil.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  _Alloc_hider _Var5;
  int iVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer pbVar8;
  pointer pbVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  const_iterator cVar12;
  const_iterator cVar13;
  Device *pDVar14;
  ostream *poVar15;
  _Rb_tree_node_base *p_Var16;
  const_iterator __begin1;
  long lVar17;
  string *psVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  long lVar19;
  size_t i_1;
  ulong uVar20;
  size_t i;
  _Rb_tree_node_base *p_Var21;
  bool bVar22;
  ModuleManager mm;
  string factories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sparseResults;
  string argStr;
  double local_1d8;
  int long_index;
  stat info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modules;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchPaths;
  string driverName;
  string serial;
  long local_a8;
  long local_a0;
  string dirStr;
  string chanStr;
  string formatStr;
  
  SoapySDR::ModuleManager::ModuleManager(&mm,false);
  serial._M_dataplus._M_p = (pointer)&serial.field_2;
  serial._M_string_length = 0;
  argStr._M_dataplus._M_p = (pointer)&argStr.field_2;
  argStr._M_string_length = 0;
  serial.field_2._M_local_buf[0] = '\0';
  formatStr._M_dataplus._M_p = (pointer)&formatStr.field_2;
  formatStr._M_string_length = 0;
  chanStr._M_dataplus._M_p = (pointer)&chanStr.field_2;
  chanStr._M_string_length = 0;
  argStr.field_2._M_local_buf[0] = '\0';
  formatStr.field_2._M_local_buf[0] = '\0';
  dirStr._M_dataplus._M_p = (pointer)&dirStr.field_2;
  dirStr._M_string_length = 0;
  driverName._M_dataplus._M_p = (pointer)&driverName.field_2;
  driverName._M_string_length = 0;
  chanStr.field_2._M_local_buf[0] = '\0';
  dirStr.field_2._M_local_buf[0] = '\0';
  bVar1 = false;
  driverName.field_2._M_local_buf[0] = '\0';
  long_index = 0;
  local_1d8 = 0.0;
  bVar22 = false;
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
switchD_001047ab_caseD_62:
  iVar6 = getopt_long_only(argc,argv,"",main::long_options,&long_index);
  switch(iVar6) {
  case 0x61:
    psVar18 = &argStr;
    break;
  case 0x62:
  case 0x65:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6f:
  case 0x71:
  case 0x75:
  case 0x76:
    goto switchD_001047ab_caseD_62;
  case 99:
    psVar18 = &driverName;
    break;
  case 100:
    psVar18 = &dirStr;
    break;
  case 0x66:
    bVar1 = true;
    if (_optarg != (char *)0x0) {
      std::__cxx11::string::assign((char *)&argStr);
    }
    goto switchD_001047ab_caseD_62;
  case 0x68:
    goto switchD_001047ab_caseD_68;
  case 0x69:
    printBanner();
    poVar11 = std::operator<<((ostream *)&std::cout,"Lib Version: v");
    SoapySDR::getLibVersion_abi_cxx11_();
    poVar11 = std::operator<<(poVar11,(string *)&info);
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::~string((string *)&info);
    poVar11 = std::operator<<((ostream *)&std::cout,"API Version: v");
    SoapySDR::getAPIVersion_abi_cxx11_();
    poVar11 = std::operator<<(poVar11,(string *)&info);
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::~string((string *)&info);
    poVar11 = std::operator<<((ostream *)&std::cout,"ABI Version: v");
    SoapySDR::getABIVersion_abi_cxx11_();
    poVar11 = std::operator<<(poVar11,(string *)&info);
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::~string((string *)&info);
    poVar11 = std::operator<<((ostream *)&std::cout,"Install root: ");
    SoapySDR::getRootPath_abi_cxx11_();
    poVar11 = std::operator<<(poVar11,(string *)&info);
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::~string((string *)&info);
    SoapySDR::listSearchPaths_abi_cxx11_();
    SoapySDR::listModules_abi_cxx11_();
    uVar20 = 0;
    for (pbVar8 = searchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar9 = modules.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        pbVar8 != searchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      if (uVar20 <= pbVar8->_M_string_length) {
        uVar20 = pbVar8->_M_string_length;
      }
    }
    for (; pbVar9 != modules.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
      if (uVar20 <= pbVar9->_M_string_length) {
        uVar20 = pbVar9->_M_string_length;
      }
    }
    for (pbVar8 = searchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar9 = modules.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        pbVar8 != searchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      iVar6 = stat((pbVar8->_M_dataplus)._M_p,(stat *)&info);
      poVar11 = std::operator<<((ostream *)&std::cout,"Search path:  ");
      std::operator<<(poVar11,(string *)pbVar8);
      if (iVar6 != 0) {
        factories._M_dataplus._M_p = (pointer)&factories.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&factories,(char)uVar20 - (char)pbVar8->_M_string_length);
        poVar11 = std::operator<<((ostream *)&std::cout,(string *)&factories);
        std::operator<<(poVar11," (missing)");
        std::__cxx11::string::~string((string *)&factories);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    for (pbVar8 = modules.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar9; pbVar8 = pbVar8 + 1)
    {
      poVar11 = std::operator<<((ostream *)&std::cout,"Module found: ");
      std::operator<<(poVar11,(string *)pbVar8);
      SoapySDR::loadModule((string *)&info);
      if (info.st_ino != 0) {
        poVar11 = std::operator<<((ostream *)&std::cout,"\n  ");
        std::operator<<(poVar11,(string *)&info);
      }
      SoapySDR::getModuleVersion((string *)&factories);
      if (factories._M_string_length != 0) {
        sparseResults.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&sparseResults.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct
                  ((ulong)&sparseResults,(char)uVar20 - (char)pbVar8->_M_string_length);
        poVar11 = std::operator<<((ostream *)&std::cout,(string *)&sparseResults);
        poVar11 = std::operator<<(poVar11," (");
        poVar11 = std::operator<<(poVar11,(string *)&factories);
        std::operator<<(poVar11,")");
        std::__cxx11::string::~string((string *)&sparseResults);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::__cxx11::string::~string((string *)&factories);
      std::__cxx11::string::~string((string *)&info);
    }
    if (modules.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        modules.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      poVar11 = std::operator<<((ostream *)&std::cout,"No modules found!");
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    std::operator<<((ostream *)&std::cout,"Available factories... ");
    factories._M_dataplus._M_p = (pointer)&factories.field_2;
    factories._M_string_length = 0;
    factories.field_2._M_local_buf[0] = '\0';
    SoapySDR::Registry::listFindFunctions_abi_cxx11_();
    for (p_Var16 = (_Rb_tree_node_base *)info._24_8_; p_Var16 != (_Rb_tree_node_base *)&info.st_ino;
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
      if (factories._M_string_length != 0) {
        std::__cxx11::string::append((char *)&factories);
      }
      std::__cxx11::string::append((string *)&factories);
    }
    std::_Rb_tree<$6c97574c$>::~_Rb_tree((_Rb_tree<_6c97574c_> *)&info);
    if (factories._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&factories);
    }
    poVar11 = std::operator<<((ostream *)&std::cout,(string *)&factories);
    std::endl<char,std::char_traits<char>>(poVar11);
    poVar11 = std::operator<<((ostream *)&std::cout,"Available converters...");
    std::endl<char,std::char_traits<char>>(poVar11);
    SoapySDR::ConverterRegistry::listAvailableSourceFormats_abi_cxx11_();
    pbVar8 = sparseResults.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar9 = sparseResults.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar8; pbVar9 = pbVar9 + 1)
    {
      info.st_dev = (__dev_t)&info.st_nlink;
      info.st_ino = 0;
      info.st_nlink._0_1_ = 0;
      SoapySDR::ConverterRegistry::listTargetFormats((string *)&local_a8);
      lVar17 = local_a0;
      for (lVar19 = local_a8; lVar19 != lVar17; lVar19 = lVar19 + 0x20) {
        if (info.st_ino != 0) {
          std::__cxx11::string::append((char *)&info);
        }
        std::__cxx11::string::append((string *)&info);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
      poVar11 = std::operator<<((ostream *)&std::cout," - ");
      *(undefined8 *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = 5;
      poVar11 = std::operator<<(poVar11,(string *)pbVar9);
      poVar11 = std::operator<<(poVar11," -> [");
      poVar11 = std::operator<<(poVar11,(string *)&info);
      poVar11 = std::operator<<(poVar11,"]");
      std::endl<char,std::char_traits<char>>(poVar11);
      std::__cxx11::string::~string((string *)&info);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sparseResults);
    std::__cxx11::string::~string((string *)&factories);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&modules);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&searchPaths);
    goto LAB_00104ee8;
  case 0x6d:
    bVar2 = true;
    if (_optarg != (char *)0x0) {
      std::__cxx11::string::assign((char *)&argStr);
    }
    goto switchD_001047ab_caseD_62;
  case 0x6e:
    psVar18 = &chanStr;
    break;
  case 0x70:
    bVar3 = true;
    if (_optarg != (char *)0x0) {
      std::__cxx11::string::assign((char *)&argStr);
    }
    goto switchD_001047ab_caseD_62;
  case 0x72:
    if (_optarg != (char *)0x0) {
      std::__cxx11::string::string((string *)&info,_optarg,(allocator *)&factories);
      local_1d8 = std::__cxx11::stod((string *)&info,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&info);
    }
    goto switchD_001047ab_caseD_62;
  case 0x73:
    bVar22 = true;
    goto switchD_001047ab_caseD_62;
  case 0x74:
    psVar18 = &formatStr;
    break;
  case 0x77:
    bVar4 = true;
    if (_optarg != (char *)0x0) {
      std::__cxx11::string::assign((char *)&argStr);
    }
    goto switchD_001047ab_caseD_62;
  default:
    if (iVar6 == 0x53) goto LAB_00104936;
    if (iVar6 == -1) {
      if (serial._M_string_length != 0) {
        SoapySDR::KwargsFromString((string *)&info);
        std::__cxx11::string::string((string *)&factories,"serial",(allocator *)&sparseResults);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&info,&factories);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        std::__cxx11::string::~string((string *)&factories);
        SoapySDR::KwargsToString((map *)&factories);
        std::__cxx11::string::operator=((string *)&argStr,(string *)&factories);
        std::__cxx11::string::~string((string *)&factories);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&info);
      }
      if (!bVar22) {
        printBanner();
      }
      if (driverName._M_string_length != 0) {
        std::operator<<((ostream *)&std::cout,"Loading modules... ");
        std::ostream::flush();
        SoapySDR::loadModules();
        poVar11 = std::operator<<((ostream *)&std::cout,"done");
        std::endl<char,std::char_traits<char>>(poVar11);
        poVar11 = std::operator<<((ostream *)&std::cout,"Checking driver \'");
        poVar11 = std::operator<<(poVar11,(string *)&driverName);
        std::operator<<(poVar11,"\'... ");
        std::ostream::flush();
        SoapySDR::Registry::listFindFunctions_abi_cxx11_();
        cVar12 = std::_Rb_tree<$6c97574c$>::find((_Rb_tree<_6c97574c_> *)&info,&driverName);
        bVar22 = cVar12._M_node == (_Base_ptr)&info.st_ino;
        if (bVar22) {
          poVar11 = std::operator<<((ostream *)&std::cout,"MISSING!");
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        else {
          poVar11 = std::operator<<((ostream *)&std::cout,"PRESENT");
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        uVar7 = (uint)bVar22;
        std::_Rb_tree<$6c97574c$>::~_Rb_tree((_Rb_tree<_6c97574c_> *)&info);
        goto LAB_00104eea;
      }
      if (bVar1) {
        SoapySDR::Device::enumerate((string *)&factories);
        if (bVar22) {
          sparseResults.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          sparseResults.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          sparseResults.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar17 = 0;
          for (uVar20 = 0; _Var5._M_p = factories._M_dataplus._M_p,
              uVar20 < (ulong)((long)(factories._M_string_length - (long)factories._M_dataplus._M_p)
                              / 0x30); uVar20 = uVar20 + 1) {
            std::__cxx11::string::string((string *)&info,"label",(allocator *)&searchPaths);
            cVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(_Var5._M_p + lVar17),(key_type *)&info);
            std::__cxx11::string::~string((string *)&info);
            if ((_Base_ptr)(factories._M_dataplus._M_p + lVar17 + 8) == cVar13._M_node) {
              SoapySDR::KwargsToString((map *)&info);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &sparseResults,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info)
              ;
              std::__cxx11::string::~string((string *)&info);
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&sparseResults,(value_type *)(cVar13._M_node + 2));
            }
            lVar17 = lVar17 + 0x30;
          }
          std::
          __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (sparseResults.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     sparseResults.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (long)(factories._M_string_length - (long)factories._M_dataplus._M_p) % 0x30);
          lVar17 = 0;
          for (uVar20 = 0;
              uVar20 < (ulong)((long)sparseResults.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)sparseResults.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar20 = uVar20 + 1) {
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            poVar11 = std::operator<<(poVar11,": ");
            poVar11 = std::operator<<(poVar11,(string *)
                                              ((long)&((sparseResults.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar17));
            std::endl<char,std::char_traits<char>>(poVar11);
            lVar17 = lVar17 + 0x20;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&sparseResults);
        }
        else {
          poVar11 = (ostream *)&std::cout;
          for (uVar20 = 0;
              uVar20 < (ulong)((long)(factories._M_string_length - (long)factories._M_dataplus._M_p)
                              / 0x30); uVar20 = uVar20 + 1) {
            poVar15 = std::operator<<((ostream *)&std::cout,"Found device ");
            poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
            std::endl<char,std::char_traits<char>>(poVar15);
            p_Var21 = (_Rb_tree_node_base *)(factories._M_dataplus._M_p + uVar20 * 0x30 + 8);
            for (p_Var16 = *(_Rb_tree_node_base **)
                            (factories._M_dataplus._M_p + uVar20 * 0x30 + 0x18); p_Var16 != p_Var21;
                p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
              poVar15 = std::operator<<((ostream *)&std::cout,"  ");
              poVar15 = std::operator<<(poVar15,(string *)(p_Var16 + 1));
              poVar15 = std::operator<<(poVar15," = ");
              poVar15 = std::operator<<(poVar15,(string *)(p_Var16 + 2));
              std::endl<char,std::char_traits<char>>(poVar15);
            }
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
          if (factories._M_dataplus._M_p == (pointer)factories._M_string_length) {
            poVar11 = std::operator<<((ostream *)&std::cerr,"No devices found! ");
            poVar11 = std::operator<<(poVar11,(string *)&argStr);
          }
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        uVar7 = (uint)(factories._M_dataplus._M_p == (pointer)factories._M_string_length);
        std::
        vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&factories);
        goto LAB_00104eea;
      }
      if (bVar2) {
        poVar11 = std::operator<<((ostream *)&std::cout,"Make device ");
        poVar11 = std::operator<<(poVar11,(string *)&argStr);
        std::endl<char,std::char_traits<char>>(poVar11);
        pDVar14 = (Device *)SoapySDR::Device::make((string *)&argStr);
        poVar11 = std::operator<<((ostream *)&std::cout,"  driver=");
        (**(code **)(*(long *)pDVar14 + 0x10))(&info,pDVar14);
        poVar11 = std::operator<<(poVar11,(string *)&info);
        std::endl<char,std::char_traits<char>>(poVar11);
        std::__cxx11::string::~string((string *)&info);
        poVar11 = std::operator<<((ostream *)&std::cout,"  hardware=");
        (**(code **)(*(long *)pDVar14 + 0x18))(&info,pDVar14);
        poVar11 = std::operator<<(poVar11,(string *)&info);
        std::endl<char,std::char_traits<char>>(poVar11);
        std::__cxx11::string::~string((string *)&info);
        (**(code **)(*(long *)pDVar14 + 0x20))(&info,pDVar14);
        for (; (__ino_t *)info._24_8_ != &info.st_ino;
            info._24_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)info._24_8_)) {
          poVar11 = std::operator<<((ostream *)&std::cout,"  ");
          poVar11 = std::operator<<(poVar11,(string *)(info._24_8_ + 0x20));
          poVar11 = std::operator<<(poVar11,"=");
          poVar11 = std::operator<<(poVar11,(string *)(info._24_8_ + 0x40));
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&info);
        SoapySDR::Device::unmake(pDVar14);
      }
      else {
        if (bVar3) {
          poVar11 = std::operator<<((ostream *)&std::cout,"Probe device ");
          poVar11 = std::operator<<(poVar11,(string *)&argStr);
          std::endl<char,std::char_traits<char>>(poVar11);
          pDVar14 = (Device *)SoapySDR::Device::make((string *)&argStr);
          SoapySDRDeviceProbe_abi_cxx11_((string *)&info,pDVar14);
          poVar11 = std::operator<<((ostream *)&std::cout,(string *)&info);
          std::endl<char,std::char_traits<char>>(poVar11);
          std::__cxx11::string::~string((string *)&info);
          SoapySDR::Device::unmake(pDVar14);
          goto LAB_00105678;
        }
        if (!bVar4) {
          if ((local_1d8 == 0.0) && (!NAN(local_1d8))) goto LAB_00104ac2;
          uVar7 = SoapySDRRateTest(&argStr,local_1d8,&formatStr,&chanStr,&dirStr);
          goto LAB_00104eea;
        }
        signal(2,sigIntHandler);
        poVar11 = std::operator<<((ostream *)&std::cout,"Watch device ");
        poVar11 = std::operator<<(poVar11,(string *)&argStr);
        poVar11 = std::operator<<(poVar11,", press Ctrl+C to exit...");
        std::endl<char,std::char_traits<char>>(poVar11);
        pDVar14 = (Device *)SoapySDR::Device::make((string *)&argStr);
        while (loopDone == '\0') {
          sensorReadings_abi_cxx11_((string *)&info,pDVar14);
          poVar11 = std::operator<<((ostream *)&std::cout,(string *)&info);
          std::endl<char,std::char_traits<char>>(poVar11);
          std::__cxx11::string::~string((string *)&info);
          info.st_dev = 1;
          std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                    ((duration<long,_std::ratio<1L,_1L>_> *)&info);
        }
        SoapySDR::Device::unmake(pDVar14);
      }
LAB_00105678:
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      goto LAB_00104ee8;
    }
    goto switchD_001047ab_caseD_62;
  }
  if (_optarg != (char *)0x0) {
    std::__cxx11::string::assign((char *)psVar18);
  }
  goto switchD_001047ab_caseD_62;
LAB_00104936:
  std::__cxx11::string::assign((char *)&serial);
  goto switchD_001047ab_caseD_62;
switchD_001047ab_caseD_68:
  printBanner();
LAB_00104ac2:
  printHelp();
LAB_00104ee8:
  uVar7 = 0;
LAB_00104eea:
  std::__cxx11::string::~string((string *)&driverName);
  std::__cxx11::string::~string((string *)&dirStr);
  std::__cxx11::string::~string((string *)&chanStr);
  std::__cxx11::string::~string((string *)&formatStr);
  std::__cxx11::string::~string((string *)&argStr);
  std::__cxx11::string::~string((string *)&serial);
  SoapySDR::ModuleManager::~ModuleManager(&mm);
  return uVar7;
}

Assistant:

int main(int argc, char *argv[])
{
    //unload any loaded modules when main() scope unwinds
    SoapySDR::ModuleManager mm(false);

    std::string serial;
    std::string argStr;
    std::string formatStr;
    std::string chanStr;
    std::string dirStr;
    double sampleRate(0.0);
    std::string driverName;
    bool findDevicesFlag(false);
    bool sparsePrintFlag(false);
    bool makeDeviceFlag(false);
    bool probeDeviceFlag(false);
    bool watchDeviceFlag(false);

    /*******************************************************************
     * parse command line options
     ******************************************************************/
    static struct option long_options[] = {
        {"help", no_argument, nullptr, 'h'},
        {"find", optional_argument, nullptr, 'f'},
        {"make", optional_argument, nullptr, 'm'},
        {"info", optional_argument, nullptr, 'i'},
        {"probe", optional_argument, nullptr, 'p'},
        {"watch", optional_argument, nullptr, 'w'},

        {"check", optional_argument, nullptr, 'c'},
        {"sparse", no_argument, nullptr, 's'},
        {"serial", required_argument, nullptr, 'S'},

        {"args", optional_argument, nullptr, 'a'},
        {"rate", optional_argument, nullptr, 'r'},
        {"format", optional_argument, nullptr, 't'},
        {"channels", optional_argument, nullptr, 'n'},
        {"direction", optional_argument, nullptr, 'd'},
        {nullptr, no_argument, nullptr, '\0'}
    };
    int long_index = 0;
    int option = 0;
    while ((option = getopt_long_only(argc, argv, "", long_options, &long_index)) != -1)
    {
        switch (option)
        {
        case 'h':
            printBanner();
            return printHelp();
        case 'i':
            printBanner();
            return printInfo();
        case 'f':
            findDevicesFlag = true;
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'm':
            makeDeviceFlag = true;
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'p':
            probeDeviceFlag = true;
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'w':
            watchDeviceFlag = true;
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'c':
            if (optarg != nullptr) driverName = optarg;
            break;
        case 's':
            sparsePrintFlag = true;
            break;
        case 'S':
            serial = optarg;
            break;
        case 'a':
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'r':
            if (optarg != nullptr) sampleRate = std::stod(optarg);
            break;
        case 't':
            if (optarg != nullptr) formatStr = optarg;
            break;
        case 'n':
            if (optarg != nullptr) chanStr = optarg;
            break;
        case 'd':
            if (optarg != nullptr) dirStr = optarg;
            break;
        }
    }

    //use serial if provided
    if (not serial.empty())
    {
        auto args = SoapySDR::KwargsFromString(argStr);
        args["serial"] = serial;
        argStr = SoapySDR::KwargsToString(args);
    }

    if (not sparsePrintFlag) printBanner();
    if (not driverName.empty()) return checkDriver(driverName);
    if (findDevicesFlag) return findDevices(argStr, sparsePrintFlag);
    if (makeDeviceFlag)  return makeDevice(argStr);
    if (probeDeviceFlag) return probeDevice(argStr);
    if (watchDeviceFlag) return watchDevice(argStr);

    //invoke utilities that rely on multiple arguments
    if (sampleRate != 0.0)
    {
        return SoapySDRRateTest(argStr, sampleRate, formatStr, chanStr, dirStr);
    }

    //unknown or unspecified options, do help...
    return printHelp();
}